

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::GRAPHVIZTreeRenderer::ToStreamInternal
          (GRAPHVIZTreeRenderer *this,RenderTree *root,ostream *ss)

{
  pointer ppVar1;
  pointer pCVar2;
  RenderTreeNode *pRVar3;
  ulong uVar4;
  string *x;
  RenderTree *this_00;
  string *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  pointer ppVar5;
  pointer pCVar6;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  string result;
  string edge_lines;
  string node_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  edges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  nodes;
  string node_format;
  string digraph_format;
  unsigned_long in_stack_fffffffffffffd98;
  optional_ptr<duckdb::RenderTreeNode,_true> local_260;
  string local_258;
  idx_t local_230;
  string *local_228;
  RenderTree *local_220;
  string local_218;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b8;
  ostream *local_198;
  allocator local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130 [32];
  string local_110 [32];
  string local_f0;
  string local_d0 [32];
  string local_b0 [32];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  local_220 = root;
  local_198 = ss;
  ::std::__cxx11::string::string
            (local_b0,
             "\ndigraph G {\n    node [shape=box, style=rounded, fontname=\"Courier New\", fontsize=10];\n%s\n%s\n}\n\t"
             ,local_190);
  local_1b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::__cxx11::string::string
            ((string *)local_190,"    node_%d_%d [label=\"%s\"];",(allocator *)&local_1f8);
  uVar4 = 0;
  this_00 = local_220;
  while (uVar4 < this_00->height) {
    x = (string *)0x0;
    local_230 = uVar4;
    while (x < (string *)this_00->width) {
      local_228 = x;
      local_260 = RenderTree::GetNode(this_00,(idx_t)x,local_230);
      if (local_260.ptr != (RenderTreeNode *)0x0) {
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_258._M_string_length = 0;
        local_258.field_2._M_allocated_capacity = 0;
        pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&local_260);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_258,&pRVar3->name);
        pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&local_260);
        ppVar1 = (pRVar3->extra_text).map.
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar5 = (pRVar3->extra_text).map.
                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      .
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1;
            ppVar5 = ppVar5 + 1) {
          QueryProfiler::JSONSanitize(&local_1f8,&ppVar5->second);
          ::std::__cxx11::string::string(local_d0,"%s:\\n%s",(allocator *)&stack0xfffffffffffffd9f);
          ::std::__cxx11::string::string((string *)&local_f0,(string *)ppVar5);
          ::std::__cxx11::string::string((string *)&local_70,(string *)&local_1f8);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    (&local_218,(StringUtil *)local_d0,&local_f0,&local_70,in_R8);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_258
                     ,&local_218);
          ::std::__cxx11::string::~string((string *)&local_218);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_f0);
          ::std::__cxx11::string::~string(local_d0);
          ::std::__cxx11::string::~string((string *)&local_1f8);
        }
        ::std::__cxx11::string::string(local_110,(string *)local_190);
        ::std::__cxx11::string::string
                  ((string *)&local_218,anon_var_dwarf_28c3943,(allocator *)&stack0xfffffffffffffd9f
                  );
        in_R8 = &local_90;
        StringUtil::Join(in_R8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)&local_258,&local_218);
        StringUtil::Format<unsigned_long,unsigned_long,std::__cxx11::string>
                  (&local_1f8,(StringUtil *)local_110,local_228,local_230,(unsigned_long)in_R8,in_R9
                  );
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1b8,
                   &local_1f8);
        ::std::__cxx11::string::~string((string *)&local_1f8);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_218);
        ::std::__cxx11::string::~string(local_110);
        pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&local_260);
        pCVar2 = (pRVar3->child_positions).
                 super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 .
                 super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pCVar6 = (pRVar3->child_positions).
                      super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                      .
                      super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                      ._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar2;
            pCVar6 = pCVar6 + 1) {
          ::std::__cxx11::string::string
                    (local_50,"    node_%d_%d -> node_%d_%d;",(allocator *)&local_218);
          in_R8 = (string *)pCVar6->x;
          in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar6->y;
          Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                    (&local_1f8,(Exception *)local_50,local_228,local_230,(unsigned_long)in_R8,
                     (unsigned_long)in_R9,in_stack_fffffffffffffd98);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8
                     ,&local_1f8);
          ::std::__cxx11::string::~string((string *)&local_1f8);
          ::std::__cxx11::string::~string(local_50);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_258);
      }
      this_00 = local_220;
      x = (string *)((long)&(local_228->_M_dataplus)._M_p + 1);
    }
    uVar4 = local_230 + 1;
  }
  ::std::__cxx11::string::string
            ((string *)&local_218,anon_var_dwarf_4bacf03 + 8,(allocator *)&local_258);
  StringUtil::Join(&local_1f8,&local_1b8,&local_218);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::string::string
            ((string *)&local_258,anon_var_dwarf_4bacf03 + 8,(allocator *)&local_260);
  StringUtil::Join(&local_218,&local_1d8,&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::string(local_130,local_b0);
  ::std::__cxx11::string::string((string *)&local_150,(string *)&local_1f8);
  ::std::__cxx11::string::string((string *)&local_170,(string *)&local_218);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
            (&local_258,(StringUtil *)local_130,&local_150,&local_170,in_R8);
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::__cxx11::string::~string((string *)&local_150);
  ::std::__cxx11::string::~string(local_130);
  ::std::operator<<(local_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_218);
  ::std::__cxx11::string::~string((string *)&local_1f8);
  ::std::__cxx11::string::~string((string *)local_190);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  ::std::__cxx11::string::~string(local_b0);
  return;
}

Assistant:

void GRAPHVIZTreeRenderer::ToStreamInternal(RenderTree &root, std::ostream &ss) {
	const string digraph_format = R"(
digraph G {
    node [shape=box, style=rounded, fontname="Courier New", fontsize=10];
%s
%s
}
	)";

	vector<string> nodes;
	vector<string> edges;

	const string node_format = R"(    node_%d_%d [label="%s"];)";

	for (idx_t y = 0; y < root.height; y++) {
		for (idx_t x = 0; x < root.width; x++) {
			auto node = root.GetNode(x, y);
			if (!node) {
				continue;
			}

			// Create Node
			vector<string> body;
			body.push_back(node->name);
			for (auto &item : node->extra_text) {
				auto &key = item.first;
				auto &value_raw = item.second;

				auto value = QueryProfiler::JSONSanitize(value_raw);
				body.push_back(StringUtil::Format("%s:\\n%s", key, value));
			}
			nodes.push_back(StringUtil::Format(node_format, x, y, StringUtil::Join(body, "\\n───\\n")));

			// Create Edge(s)
			for (auto &coord : node->child_positions) {
				edges.push_back(StringUtil::Format("    node_%d_%d -> node_%d_%d;", x, y, coord.x, coord.y));
			}
		}
	}
	auto node_lines = StringUtil::Join(nodes, "\n");
	auto edge_lines = StringUtil::Join(edges, "\n");

	string result = StringUtil::Format(digraph_format, node_lines, edge_lines);
	ss << result;
}